

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> * __thiscall
embree::XMLLoader::loadVec4iArray
          (vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> *__return_storage_ptr__,
          XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  pointer pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  runtime_error *this_01;
  long *plVar6;
  size_type *psVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  string local_70;
  string local_50;
  
  this_00 = xml->ptr;
  if (this_00 == (XML *)0x0) {
    (__return_storage_ptr__->
    super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ofs","");
    XML::parm(&local_50,this_00,&local_70);
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (iVar2 == 0) {
      (__return_storage_ptr__->
      super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar9 = ((long)(xml->ptr->body).
                     super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(xml->ptr->body).
                     super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
      if ((uVar9 & 3) != 0) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_(&local_70,&xml->ptr->loc);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_50._M_dataplus._M_p = (pointer)*plVar6;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((size_type *)local_50._M_dataplus._M_p == psVar7) {
          local_50.field_2._M_allocated_capacity = *psVar7;
          local_50.field_2._8_8_ = plVar6[3];
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        }
        else {
          local_50.field_2._M_allocated_capacity = *psVar7;
        }
        local_50._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::runtime_error::runtime_error(this_01,(string *)&local_50);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::resize
                (__return_storage_ptr__,uVar9 >> 2);
      if ((__return_storage_ptr__->
          super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>)._M_impl.
          super__Vector_impl_data._M_finish !=
          (__return_storage_ptr__->
          super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        lVar10 = 0xc;
        lVar8 = 0;
        uVar9 = 0;
        do {
          iVar2 = Token::Int((Token *)((long)&((xml->ptr->body).
                                               super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->ty +
                                      lVar8));
          iVar3 = Token::Int((Token *)((long)&(xml->ptr->body).
                                              super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                              ._M_impl.super__Vector_impl_data._M_start[1].ty +
                                      lVar8));
          iVar4 = Token::Int((Token *)((long)&(xml->ptr->body).
                                              super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                              ._M_impl.super__Vector_impl_data._M_start[2].ty +
                                      lVar8));
          iVar5 = Token::Int((Token *)((long)&(xml->ptr->body).
                                              super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                              ._M_impl.super__Vector_impl_data._M_start[3].ty +
                                      lVar8));
          pVVar1 = (__return_storage_ptr__->
                   super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          *(int *)((long)pVVar1 + lVar10 + -0xc) = iVar2;
          *(int *)((long)pVVar1 + lVar10 + -8) = iVar3;
          *(int *)((long)pVVar1 + lVar10 + -4) = iVar4;
          *(int *)((long)&pVVar1->field_0 + lVar10) = iVar5;
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + 0x120;
          lVar10 = lVar10 + 0x10;
        } while (uVar9 < (ulong)((long)(__return_storage_ptr__->
                                       super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(__return_storage_ptr__->
                                       super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start >> 4));
      }
    }
    else {
      loadBinary<std::vector<embree::Vec4<int>,std::allocator<embree::Vec4<int>>>>
                (__return_storage_ptr__,this,xml);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vec4i> XMLLoader::loadVec4iArray(const Ref<XML>& xml)
  {
    if (!xml) return std::vector<Vec4i>();

    if (xml->parm("ofs") != "") {
      return loadBinary<std::vector<Vec4i>>(xml);
    } 
    else 
    {
      std::vector<Vec4i> data;
      if (xml->body.size() % 4 != 0) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong vector<int4> body");
      data.resize(xml->body.size()/4);
      for (size_t i=0; i<data.size(); i++) 
        data[i] = Vec4i(xml->body[4*i+0].Int(),xml->body[4*i+1].Int(),xml->body[4*i+2].Int(),xml->body[4*i+3].Int());
      return data;
    }
  }